

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1e006::
ARTScanTest_scanRangeForward1000_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanRangeForward1000_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  pointer *this_00;
  int iVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  char *message;
  undefined1 local_2a8 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  iterator it;
  uint64_t expected;
  visitor_type v;
  uint64_t n;
  size_t *local_40;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_38;
  art_key_type from_key_;
  bool match;
  
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_2a8,false);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert_key_range_internal
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_2a8,0,1000,false);
  n = (uint64_t)&v;
  v.it = (iterator *)0x0;
  local_40 = &it.keybuf_.off;
  it.keybuf_.off = 0;
  local_38.key = 0;
  iVar1 = unodb::detail::basic_art_key<unsigned_long>::cmp
                    ((basic_art_key<unsigned_long> *)&local_38.key_bytes,(void *)0xe803000000000000,
                     extraout_RDX);
  if (iVar1 != 0) {
    from_key_.field_0.key_bytes._M_elems[7] = 0;
    this_00 = &verifier.key_views.
               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    expected = (uint64_t)this_00;
    if (iVar1 < 0) {
      unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
      iterator((iterator *)this_00,
               (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
      unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
                ((iterator *)this_00,(art_key_type)local_38.key_bytes._M_elems,
                 (bool *)(from_key_.field_0.key_bytes._M_elems + 7),true);
      pvVar2 = extraout_RDX_02;
      while (it.stack_.c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             it.stack_.c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size) {
        iVar1 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                iterator::cmp((iterator *)this_00,(void *)0xe803000000000000,pvVar2);
        if (-1 < iVar1) break;
        TestBody::anon_class_16_2_56a65ec1::operator()
                  ((anon_class_16_2_56a65ec1 *)&n,
                   (visitor<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator>
                    *)&expected);
        unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
        next((iterator *)this_00);
        pvVar2 = extraout_RDX_03;
      }
    }
    else {
      unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
      iterator((iterator *)this_00,
               (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
      unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
                ((iterator *)this_00,(art_key_type)local_38.key_bytes._M_elems,
                 (bool *)(from_key_.field_0.key_bytes._M_elems + 7),false);
      pvVar2 = extraout_RDX_00;
      while (it.stack_.c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             it.stack_.c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size) {
        iVar1 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                iterator::cmp((iterator *)this_00,(void *)0xe803000000000000,pvVar2);
        if (iVar1 < 1) break;
        TestBody::anon_class_16_2_56a65ec1::operator()
                  ((anon_class_16_2_56a65ec1 *)&n,
                   (visitor<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator>
                    *)&expected);
        unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
        prior((iterator *)this_00);
        pvVar2 = extraout_RDX_01;
      }
    }
    unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    ~iterator((iterator *)
              &verifier.key_views.
               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  n = CONCAT44(n._4_4_,1000);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"(1000)","(n)",(int *)&n,
             (unsigned_long *)&v);
  if ((char)verifier.key_views.
            super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&n);
    if (it.db_ == (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
      message = "";
    }
    else {
      message = (char *)((it.db_)->root).tagged_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38.key_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x23c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38.key_bytes,(Message *)&n);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38.key_bytes);
    if (n != 0) {
      (**(code **)(*(long *)n + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)local_2a8);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeForward1000) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert_key_range(0, 1000);
  uint64_t n = 0;
  uint64_t expected = 0;
  const auto fn = [&n, &expected](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    const auto key = decode(v.get_key());
    UNODB_EXPECT_EQ(expected, key);
    expected++;
    return false;
  };
  db.scan_range(0, 1000, fn);
  UNODB_EXPECT_EQ(1000, n);
}